

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_type(exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,
                   char *tname,int32_t attrsz)

{
  long lVar1;
  exr_result_t eVar2;
  int iVar3;
  exr_context_t in_RCX;
  exr_attribute_list_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  uint in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  int32_t n;
  uint8_t *outstr;
  exr_result_t rv;
  int32_t in_stack_ffffffffffffffc4;
  int32_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = check_bad_attrsz((_internal_exr_seq_scratch *)in_RSI,(int32_t)((ulong)in_RDX >> 0x20),
                           (int32_t)in_RDX,(char *)in_RCX,
                           (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8);
  if (eVar2 == 0) {
    lVar1._0_4_ = in_RSI->max_tile_w;
    lVar1._4_4_ = in_RSI->max_tile_h;
    if (lVar1 == 0) {
      iVar3 = strcmp((char *)in_RCX,"string");
      if (iVar3 == 0) {
        eVar2 = exr_attr_list_add_static_name
                          ((exr_context_t)CONCAT44(attrsz,rv),(exr_attribute_list_t *)outstr,
                           in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                           (uint8_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(exr_attribute_t **)curpart);
        if (eVar2 == 0) {
          iVar3 = (*(code *)in_RDX[1].entries)(in_RDX,in_stack_ffffffffffffffc8,(long)(int)in_R8D);
          if (iVar3 == 0) {
            *(undefined1 *)((long)in_stack_ffffffffffffffc8 + (long)(int)in_R8D) = 0;
            eVar2 = exr_attr_string_init_static_with_length
                              (in_RCX,(exr_attr_string_t *)((ulong)in_R8D << 0x20),
                               (char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
            if (eVar2 == 0) {
              iVar3 = strcmp((char *)in_stack_ffffffffffffffc8,"scanlineimage");
              if (iVar3 == 0) {
                if ((*(char *)(in_RDI + 4) != '\0') || (*(char *)(in_RDI + 5) != '\0')) {
                  in_RSI->has_nonimage_data = '\0';
                  in_RSI->is_multipart = '\0';
                  in_RSI->strict_header = '\0';
                  in_RSI->silent_header = '\0';
                }
              }
              else {
                iVar3 = strcmp((char *)in_stack_ffffffffffffffc8,"tiledimage");
                if (iVar3 == 0) {
                  if ((*(char *)(in_RDI + 4) != '\0') || (*(char *)(in_RDI + 5) != '\0')) {
                    in_RSI->has_nonimage_data = '\x01';
                    in_RSI->is_multipart = '\0';
                    in_RSI->strict_header = '\0';
                    in_RSI->silent_header = '\0';
                  }
                }
                else {
                  iVar3 = strcmp((char *)in_stack_ffffffffffffffc8,"deepscanline");
                  if (iVar3 == 0) {
                    if ((*(char *)(in_RDI + 4) != '\0') || (*(char *)(in_RDI + 5) != '\0')) {
                      in_RSI->has_nonimage_data = '\x02';
                      in_RSI->is_multipart = '\0';
                      in_RSI->strict_header = '\0';
                      in_RSI->silent_header = '\0';
                    }
                  }
                  else {
                    iVar3 = strcmp((char *)in_stack_ffffffffffffffc8,"deeptile");
                    if (iVar3 == 0) {
                      if ((*(char *)(in_RDI + 4) != '\0') || (*(char *)(in_RDI + 5) != '\0')) {
                        in_RSI->has_nonimage_data = '\x03';
                        in_RSI->is_multipart = '\0';
                        in_RSI->strict_header = '\0';
                        in_RSI->silent_header = '\0';
                      }
                    }
                    else {
                      if (*(char *)(in_RDI + 6) != '\0') {
                        (**(code **)(in_RDI + 0x48))
                                  (in_RDI,0xe,"attribute \'type\': Unknown type string \'%s\'",
                                   in_stack_ffffffffffffffc8);
                      }
                      iVar3._0_1_ = in_RSI->has_nonimage_data;
                      iVar3._1_1_ = in_RSI->is_multipart;
                      iVar3._2_1_ = in_RSI->strict_header;
                      iVar3._3_1_ = in_RSI->silent_header;
                      if (iVar3 == 4) {
                        in_RSI->has_nonimage_data = '\x05';
                        in_RSI->is_multipart = '\0';
                        in_RSI->strict_header = '\0';
                        in_RSI->silent_header = '\0';
                      }
                    }
                  }
                }
              }
            }
            else {
              exr_attr_list_remove(in_RSI,in_RDX,(exr_attribute_t *)in_RCX);
              in_RSI->max_tile_w = 0;
              in_RSI->max_tile_h = 0;
              eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,eVar2,"Unable to read \'name\' data");
            }
          }
          else {
            exr_attr_list_remove(in_RSI,in_RDX,(exr_attribute_t *)in_RCX);
            in_RSI->max_tile_w = 0;
            in_RSI->max_tile_h = 0;
            eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,iVar3,"Unable to read \'name\' data");
          }
        }
        else {
          (*(code *)in_RDX[1].sorted_entries)(in_RDX,in_R8D);
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,eVar2,"Unable to initialize attribute \'%s\', type \'string\'",
                             "type");
        }
      }
      else {
        (*(code *)in_RDX[1].sorted_entries)(in_RDX,in_R8D);
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0x10,"Required attribute \'type\': Invalid type \'%s\'",in_RCX);
      }
    }
    else {
      (*(code *)in_RDX[1].sorted_entries)(in_RDX,in_R8D);
      eVar2 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Duplicate copy of required attribute \'type\' encountered");
    }
  }
  return eVar2;
}

Assistant:

static exr_result_t
check_populate_type (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;
    uint8_t*     outstr;
    int32_t      n;

    rv = check_bad_attrsz (scratch, attrsz, 1, EXR_REQ_TYPE_STR, tname, &n);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (curpart->type)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Duplicate copy of required attribute 'type' encountered");
    }

    if (0 != strcmp (tname, "string"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute 'type': Invalid type '%s'",
            tname);
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_TYPE_STR,
        EXR_ATTR_STRING,
        attrsz + 1,
        &outstr,
        &(curpart->type));
    if (rv != EXR_ERR_SUCCESS)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'string'",
            EXR_REQ_TYPE_STR);
    }

    rv = scratch->sequential_read (scratch, outstr, (uint64_t) attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (ctxt, &(curpart->attributes), curpart->type);
        curpart->type = NULL;
        return ctxt->report_error (ctxt, rv, "Unable to read 'name' data");
    }
    outstr[attrsz] = '\0';

    rv = exr_attr_string_init_static_with_length (
        ctxt, curpart->type->string, (const char*) outstr, attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (ctxt, &(curpart->attributes), curpart->type);
        curpart->type = NULL;
        return ctxt->report_error (ctxt, rv, "Unable to read 'name' data");
    }

    if (strcmp ((const char*) outstr, "scanlineimage") == 0)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
            curpart->storage_mode = EXR_STORAGE_SCANLINE;
    }
    else if (strcmp ((const char*) outstr, "tiledimage") == 0)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
            curpart->storage_mode = EXR_STORAGE_TILED;
    }
    else if (strcmp ((const char*) outstr, "deepscanline") == 0)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
            curpart->storage_mode = EXR_STORAGE_DEEP_SCANLINE;
    }
    else if (strcmp ((const char*) outstr, "deeptile") == 0)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
            curpart->storage_mode = EXR_STORAGE_DEEP_TILED;
    }
    else
    {
        if (ctxt->strict_header)
            ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "attribute 'type': Unknown type string '%s'",
                outstr);
        if (curpart->storage_mode == EXR_STORAGE_LAST_TYPE)
            curpart->storage_mode = EXR_STORAGE_UNKNOWN;
    }

    return rv;
}